

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::Promise<void>::attach<capnproto_test::capnp::test::TestInterface::Client>
          (Promise<void> *this,Client *attachments)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long *in_RDX;
  AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client> *pAVar5;
  AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client> *extraout_RDX;
  Own<kj::_::AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client>_> OVar6;
  Promise<void> PVar7;
  undefined1 local_30 [16];
  long *plStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  puVar1 = (undefined8 *)((long)in_RDX + *(long *)(*in_RDX + -0x18));
  local_30._8_8_ = *puVar1;
  plStack_20 = (long *)puVar1[1];
  *(undefined8 *)((long)in_RDX + *(long *)(*in_RDX + -0x18) + 8) = 0;
  local_30._0_8_ = &capnp::Capability::Client::typeinfo;
  OVar6 = heap<kj::_::AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client>,kj::Own<kj::_::PromiseNode>,capnproto_test::capnp::test::TestInterface::Client>
                    ((kj *)&local_18,(Own<kj::_::PromiseNode> *)attachments,(Client *)local_30);
  plVar2 = plStack_20;
  pAVar5 = OVar6.ptr;
  uVar3 = (undefined4)uStack_10;
  uVar4 = uStack_10._4_4_;
  uStack_10 = 0;
  *(undefined4 *)&(this->super_PromiseBase).node.disposer = local_18;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.disposer + 4) = uStack_14;
  *(undefined4 *)&(this->super_PromiseBase).node.ptr = uVar3;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.ptr + 4) = uVar4;
  if (plStack_20 != (long *)0x0) {
    plStack_20 = (long *)0x0;
    (*(code *)**(undefined8 **)local_30._8_8_)
              (local_30._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    pAVar5 = extraout_RDX;
  }
  PVar7.super_PromiseBase.node.ptr = (PromiseNode *)pAVar5;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}